

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_intermediate_code_aarch64(CPUState *cpu,TranslationBlock *tb,int max_insns)

{
  uint32_t uVar1;
  TranslatorOps *local_180;
  TranslatorOps *ops;
  DisasContext_conflict1 dc;
  int max_insns_local;
  TranslationBlock *tb_local;
  CPUState *cpu_local;
  
  dc.uc._4_4_ = max_insns;
  memset(&ops,0,0x158);
  local_180 = &arm_translator_ops;
  uVar1 = extract32(tb->flags,8,1);
  if (uVar1 != 0) {
    local_180 = &thumb_translator_ops;
  }
  uVar1 = extract32(tb->flags,0x1f,1);
  if (uVar1 != 0) {
    local_180 = &aarch64_translator_ops_aarch64;
  }
  translator_loop_aarch64(local_180,(DisasContextBase *)&ops,cpu,tb,dc.uc._4_4_);
  return;
}

Assistant:

void gen_intermediate_code(CPUState *cpu, TranslationBlock *tb, int max_insns)
{
    DisasContext dc = { 0 };
    const TranslatorOps *ops = &arm_translator_ops;

    if (FIELD_EX32(tb->flags, TBFLAG_AM32, THUMB)) {
        ops = &thumb_translator_ops;
    }
#ifdef TARGET_AARCH64
    if (FIELD_EX32(tb->flags, TBFLAG_ANY, AARCH64_STATE)) {
        ops = &aarch64_translator_ops;
    }
#endif

    translator_loop(ops, &dc.base, cpu, tb, max_insns);
}